

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

uint64_t HashFile(string *filename,bool one_block)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined7 in_register_00000031;
  uint64_t uVar8;
  allocator local_282;
  allocator local_281;
  Logger local_280;
  undefined4 local_27c;
  vector<char,_std::allocator<char>_> buffer;
  string local_258;
  ifstream f;
  byte abStack_218 [488];
  
  local_27c = (undefined4)CONCAT71(in_register_00000031,one_block);
  std::ifstream::ifstream(&f,(string *)filename,_S_bin|_S_ate);
  if ((abStack_218[*(long *)(_f + -0x18)] & 1) == 0) {
    lVar2 = std::istream::tellg();
    std::istream::seekg((long)&f,_S_beg);
    iVar1 = std::istream::tellg();
    if (iVar1 != 0) {
      local_280.severity_ = ERR;
      std::__cxx11::string::string
                ((string *)&buffer,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                 ,&local_281);
      std::__cxx11::string::string((string *)&local_258,"HashFile",&local_282);
      poVar3 = Logger::Start(ERR,(string *)&buffer,0x14d,&local_258);
      poVar3 = std::operator<<(poVar3,"CHECK_EQ failed ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x14d);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"static_cast<int>(f.tellg())");
      poVar3 = std::operator<<(poVar3," = ");
      iVar1 = std::istream::tellg();
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"0");
      poVar3 = std::operator<<(poVar3," = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&buffer);
      Logger::~Logger(&local_280);
      abort();
    }
    uVar8 = 0x160f7;
    lVar6 = 0;
    do {
      if (lVar2 <= lVar6) break;
      lVar7 = lVar6 + 0xfa000;
      if (lVar2 < lVar6 + 0xfa000) {
        lVar7 = lVar2;
      }
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)
                 &buffer.super__Vector_base<char,_std::allocator<char>_>,0xfa000,
                 (allocator_type *)&local_258);
      std::istream::read((char *)&f,
                         (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start);
      for (lVar4 = 0; lVar4 < (lVar7 - lVar6) + -8; lVar4 = lVar4 + 8) {
        lVar5 = *(long *)(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar4);
        uVar8 = ((lVar5 + 1 + uVar8) * (lVar5 + uVar8) >> 1) + lVar5;
      }
      for (; lVar4 < lVar7 - lVar6; lVar4 = lVar4 + 1) {
        lVar5 = (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar4];
        uVar8 = ((uVar8 + lVar5) * (uVar8 + 1 + lVar5) >> 1) + lVar5;
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&buffer.super__Vector_base<char,_std::allocator<char>_>);
      lVar6 = lVar7;
    } while ((char)local_27c == '\0');
  }
  else {
    uVar8 = 0;
  }
  std::ifstream::~ifstream(&f);
  return uVar8;
}

Assistant:

inline uint64_t HashFile(const std::string &filename, bool one_block=false) {
  std::ifstream f(filename, std::ios::ate | std::ios::binary);
  if (f.bad()) { return 0; }

  long end = (long) f.tellg();
  f.seekg(0, std::ios::beg);
  CHECK_EQ(static_cast<int>(f.tellg()), 0);

  uint64_t magic = 90359;
  for (long pos = 0; pos < end; ) {
#ifndef _MSC_VER
    long next_pos = std::min(pos + kChunkSize, end);
#else
    long next_pos = __min(pos + kChunkSize, end);
#endif
    long size = next_pos - pos;
    std::vector<char> buffer(kChunkSize);
    f.read(buffer.data(), size);

    int i = 0;
    while (i < size - 8) {
      uint64_t x = *reinterpret_cast<uint64_t *>(buffer.data() + i);
      magic = ((magic + x) * (magic + x + 1) >> 1) + x;
      i += 8;
    }
    for ( ; i < size; i++) {
      char x = buffer[i];
      magic = ((magic + x) * (magic + x + 1) >> 1) + x;
    }

    pos = next_pos;
    if (one_block) { break; }
  }

  return magic;
}